

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollArea::mouseReleaseEvent(AbstractScrollArea *this,QMouseEvent *e)

{
  AbstractScrollAreaPrivate *this_00;
  QMouseEvent QVar1;
  
  if (*(int *)(e + 0x40) == 1) {
    this_00 = (this->d).d;
    this_00->leftMouseButtonPressed = false;
    if (((this_00->horIndicator->needPaint == false) && (this_00->vertIndicator->needPaint != true))
       || ((this_00->horIndicator->policy != ScrollIndicatorAsNeeded &&
           (this_00->vertIndicator->policy != ScrollIndicatorAsNeeded)))) {
      AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation(this_00);
    }
    else {
      AbstractScrollAreaPrivate::animateScrollIndicators(this_00);
    }
    AbstractScrollAreaPrivate::animateHiddingBlurEffect((this->d).d);
    QVar1 = (QMouseEvent)0x1;
  }
  else {
    QVar1 = (QMouseEvent)0x0;
  }
  e[0xc] = QVar1;
  return;
}

Assistant:

void
AbstractScrollArea::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		d->leftMouseButtonPressed = false;

		if( ( d->horIndicator->needPaint || d->vertIndicator->needPaint ) &&
			( d->horIndicator->policy == ScrollIndicatorAsNeeded ||
				d->vertIndicator->policy == ScrollIndicatorAsNeeded ) )
					d->animateScrollIndicators();
		else
			d->stopScrollIndicatorsAnimation();

		d->animateHiddingBlurEffect();

		e->accept();
	}
	else
		e->ignore();
}